

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::VariableReferenceVisitor,_false,_true,_false,_false>::
visit<slang::ast::HierarchicalValueExpression>
          (ASTVisitor<netlist::VariableReferenceVisitor,_false,_true,_false,_false> *this,
          HierarchicalValueExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  ValueExpressionBase *in_stack_000001e8;
  VariableReferenceVisitor *in_stack_000001f0;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    netlist::VariableReferenceVisitor::handle(in_stack_000001f0,in_stack_000001e8);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }